

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  _Base_ptr p_Var1;
  long *plVar2;
  mapped_type *pmVar3;
  Type *descriptor;
  long *plVar4;
  size_type *psVar5;
  _Base_ptr p_Var6;
  int iVar7;
  _Rb_tree_header *p_Var8;
  _Rb_tree_header *p_Var9;
  long lVar10;
  long lVar11;
  string error;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  key_type local_ec;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  string local_c8;
  DescriptorBuilder *local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_a8 = this;
  if (0 < *(int *)(enm + 4)) {
    iVar7 = 0;
    do {
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                (&(proto->value_).super_RepeatedPtrFieldBase,iVar7);
      iVar7 = iVar7 + 1;
    } while (iVar7 < *(int *)(enm + 4));
  }
  if (((*(byte *)(*(long *)(enm + 0x20) + 0x28) & 1) == 0) ||
     (*(char *)(*(long *)(enm + 0x20) + 0x48) == '\0')) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < *(int *)(enm + 4)) {
      lVar10 = 0;
      do {
        p_Var9 = &local_60._M_impl.super__Rb_tree_header;
        iVar7 = *(int *)(*(long *)(enm + 0x28) + 4 + lVar10 * 0x20);
        p_Var6 = &p_Var9->_M_header;
        for (p_Var1 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var1 != (_Rb_tree_header *)0x0;
            p_Var1 = (&p_Var1->_M_left)[(int)*(size_t *)(p_Var1 + 1) < iVar7]) {
          if (iVar7 <= (int)*(size_t *)(p_Var1 + 1)) {
            p_Var6 = p_Var1;
          }
        }
        p_Var8 = p_Var9;
        if (((_Rb_tree_header *)p_Var6 != p_Var9) &&
           (p_Var8 = (_Rb_tree_header *)p_Var6,
           iVar7 < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
          p_Var8 = p_Var9;
        }
        lVar11 = *(long *)(enm + 0x28) + lVar10 * 0x20;
        if (p_Var8 == p_Var9) {
          local_c8._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar11 + 4);
          pmVar3 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,(key_type *)&local_c8);
          std::__cxx11::string::_M_assign((string *)pmVar3);
        }
        else {
          std::operator+(&local_80,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(lVar11 + 8) + 0x20));
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar4 = plVar2 + 2;
          if ((long *)*plVar2 == plVar4) {
            local_d8 = *plVar4;
            lStack_d0 = plVar2[3];
            local_e8 = &local_d8;
          }
          else {
            local_d8 = *plVar4;
            local_e8 = (long *)*plVar2;
          }
          local_e0 = plVar2[1];
          *plVar2 = (long)plVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          local_ec = *(key_type *)(lVar11 + 4);
          pmVar3 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_ec);
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_e8,(ulong)(pmVar3->_M_dataplus)._M_p);
          plVar4 = plVar2 + 2;
          if ((long *)*plVar2 == plVar4) {
            local_90 = *plVar4;
            lStack_88 = plVar2[3];
            local_a0 = &local_90;
          }
          else {
            local_90 = *plVar4;
            local_a0 = (long *)*plVar2;
          }
          local_98 = plVar2[1];
          *plVar2 = (long)plVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_c8.field_2._M_allocated_capacity = *psVar5;
            local_c8.field_2._8_8_ = plVar2[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar5;
            local_c8._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_c8._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          if (local_a0 != &local_90) {
            operator_delete(local_a0);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if (*(char *)(*(long *)(enm + 0x20) + 0x48) == '\0') {
            lVar11 = *(long *)(enm + 8);
            descriptor = internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                                   (&(proto->value_).super_RepeatedPtrFieldBase,(int)lVar10);
            AddError(local_a8,(string *)(lVar11 + 0x20),&descriptor->super_Message,NUMBER,&local_c8)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < *(int *)(enm + 4));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    std::map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        std::string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] +
            "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, error);
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}